

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O0

FT_Error pfr_slot_load(FT_GlyphSlot_conflict pfrslot,FT_Size pfrsize,FT_UInt gindex,
                      FT_Int32 load_flags)

{
  uint uVar1;
  FT_Face pFVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  FT_Error FVar5;
  FT_Int32 FVar6;
  FT_Outline *outline_00;
  long lVar7;
  FT_Int32 b;
  FT_Vector *local_b0;
  FT_Vector *vec;
  FT_Fixed y_scale;
  FT_Fixed x_scale;
  FT_Int n;
  FT_Bool scaling;
  FT_UInt em_outline;
  FT_UInt em_metrics;
  FT_Pos advance;
  FT_Glyph_Metrics *metrics;
  FT_BBox cbox;
  FT_ULong gps_offset;
  FT_Outline *outline;
  PFR_Char gchar;
  PFR_Face face;
  FT_Error error;
  PFR_Size size;
  PFR_Slot slot;
  FT_Int32 load_flags_local;
  FT_UInt gindex_local;
  FT_Size pfrsize_local;
  FT_GlyphSlot_conflict pfrslot_local;
  
  pFVar2 = pfrslot->face;
  outline_00 = &pfrslot->outline;
  slot._4_4_ = gindex;
  if (gindex != 0) {
    slot._4_4_ = gindex - 1;
  }
  if ((pFVar2 == (FT_Face)0x0) || (*(uint *)&pFVar2[2].generic.data <= slot._4_4_)) {
    face._4_4_ = 6;
  }
  else if (((load_flags & 9U) == 0) &&
          (FVar5 = pfr_slot_load_bitmap
                             ((PFR_Slot)pfrslot,(PFR_Size)pfrsize,slot._4_4_,
                              (load_flags & 0x400000U) != 0), FVar5 == 0)) {
    face._4_4_ = 0;
  }
  else if ((load_flags & 0x4000U) == 0) {
    lVar7 = pFVar2[2].bbox.xMin + (ulong)slot._4_4_ * 0x10;
    pfrslot->format = FT_GLYPH_FORMAT_OUTLINE;
    (pfrslot->outline).n_points = 0;
    outline_00->n_contours = 0;
    cbox.yMax = (FT_Pos)(uint)pFVar2[1].num_fixed_sizes;
    face._4_4_ = pfr_glyph_load((PFR_Glyph)(pfrslot + 1),pFVar2->stream,cbox.yMax,
                                (ulong)*(uint *)(lVar7 + 0xc),(ulong)*(uint *)(lVar7 + 8));
    if (face._4_4_ == 0) {
      memcpy(outline_00,pfrslot[1].generic.finalizer + 0x18,0x28);
      (pfrslot->outline).flags = (pfrslot->outline).flags & 0xfffffffe;
      (pfrslot->outline).flags = (pfrslot->outline).flags | 4;
      if ((pfrsize != (FT_Size)0x0) && ((pfrsize->metrics).y_ppem < 0x18)) {
        (pfrslot->outline).flags = (pfrslot->outline).flags | 0x100;
      }
      (pfrslot->metrics).horiAdvance = 0;
      (pfrslot->metrics).vertAdvance = 0;
      _em_outline = (long)*(int *)(lVar7 + 4);
      uVar1 = *(uint *)((long)&pFVar2[1].driver + 4);
      if (uVar1 != *(uint *)&pFVar2[1].driver) {
        _em_outline = FT_MulDiv(_em_outline,(ulong)*(uint *)&pFVar2[1].driver,(ulong)uVar1);
      }
      if (((ulong)pFVar2[1].autohint.data & 1) == 0) {
        (pfrslot->metrics).horiAdvance = _em_outline;
      }
      else {
        (pfrslot->metrics).vertAdvance = _em_outline;
      }
      pfrslot->linearHoriAdvance = (pfrslot->metrics).horiAdvance;
      pfrslot->linearVertAdvance = (pfrslot->metrics).vertAdvance;
      (pfrslot->metrics).vertBearingX = 0;
      (pfrslot->metrics).vertBearingY = 0;
      if ((load_flags & 1U) == 0) {
        FVar3 = (pfrsize->metrics).x_scale;
        FVar4 = (pfrsize->metrics).y_scale;
        local_b0 = (pfrslot->outline).points;
        x_scale._0_4_ = 0;
        while( true ) {
          FVar6 = (FT_Int32)FVar3;
          b = (FT_Int32)FVar4;
          if ((pfrslot->outline).n_points <= (int)x_scale) break;
          FVar6 = FT_MulFix_x86_64((FT_Int32)local_b0->x,FVar6);
          local_b0->x = (long)FVar6;
          FVar6 = FT_MulFix_x86_64((FT_Int32)local_b0->y,b);
          local_b0->y = (long)FVar6;
          x_scale._0_4_ = (int)x_scale + 1;
          local_b0 = local_b0 + 1;
        }
        FVar6 = FT_MulFix_x86_64((FT_Int32)(pfrslot->metrics).horiAdvance,FVar6);
        (pfrslot->metrics).horiAdvance = (long)FVar6;
        FVar6 = FT_MulFix_x86_64((FT_Int32)(pfrslot->metrics).vertAdvance,b);
        (pfrslot->metrics).vertAdvance = (long)FVar6;
      }
      FT_Outline_Get_CBox(outline_00,(FT_BBox *)&metrics);
      (pfrslot->metrics).width = cbox.yMin - (long)metrics;
      (pfrslot->metrics).height = cbox.xMax - cbox.xMin;
      (pfrslot->metrics).horiBearingX = (FT_Pos)metrics;
      (pfrslot->metrics).horiBearingY = cbox.xMax - (pfrslot->metrics).height;
    }
  }
  else {
    face._4_4_ = 6;
  }
  return face._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_slot_load( FT_GlyphSlot  pfrslot,         /* PFR_Slot */
                 FT_Size       pfrsize,         /* PFR_Size */
                 FT_UInt       gindex,
                 FT_Int32      load_flags )
  {
    PFR_Slot     slot    = (PFR_Slot)pfrslot;
    PFR_Size     size    = (PFR_Size)pfrsize;
    FT_Error     error;
    PFR_Face     face    = (PFR_Face)pfrslot->face;
    PFR_Char     gchar;
    FT_Outline*  outline = &pfrslot->outline;
    FT_ULong     gps_offset;


    FT_TRACE1(( "pfr_slot_load: glyph index %d\n", gindex ));

    if ( gindex > 0 )
      gindex--;

    if ( !face || gindex >= face->phy_font.num_chars )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* try to load an embedded bitmap */
    if ( ( load_flags & ( FT_LOAD_NO_SCALE | FT_LOAD_NO_BITMAP ) ) == 0 )
    {
      error = pfr_slot_load_bitmap(
                slot,
                size,
                gindex,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      if ( !error )
        goto Exit;
    }

    if ( load_flags & FT_LOAD_SBITS_ONLY )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    gchar               = face->phy_font.chars + gindex;
    pfrslot->format     = FT_GLYPH_FORMAT_OUTLINE;
    outline->n_points   = 0;
    outline->n_contours = 0;
    gps_offset          = face->header.gps_section_offset;

    /* load the glyph outline (FT_LOAD_NO_RECURSE isn't supported) */
    error = pfr_glyph_load( &slot->glyph, face->root.stream,
                            gps_offset, gchar->gps_offset, gchar->gps_size );

    if ( !error )
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &pfrslot->metrics;
      FT_Pos             advance;
      FT_UInt            em_metrics, em_outline;
      FT_Bool            scaling;


      scaling = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE ) == 0 );

      /* copy outline data */
      *outline = slot->glyph.loader->base.outline;

      outline->flags &= ~FT_OUTLINE_OWNER;
      outline->flags |= FT_OUTLINE_REVERSE_FILL;

      if ( size && pfrsize->metrics.y_ppem < 24 )
        outline->flags |= FT_OUTLINE_HIGH_PRECISION;

      /* compute the advance vector */
      metrics->horiAdvance = 0;
      metrics->vertAdvance = 0;

      advance    = gchar->advance;
      em_metrics = face->phy_font.metrics_resolution;
      em_outline = face->phy_font.outline_resolution;

      if ( em_metrics != em_outline )
        advance = FT_MulDiv( advance,
                             (FT_Long)em_outline,
                             (FT_Long)em_metrics );

      if ( face->phy_font.flags & PFR_PHY_VERTICAL )
        metrics->vertAdvance = advance;
      else
        metrics->horiAdvance = advance;

      pfrslot->linearHoriAdvance = metrics->horiAdvance;
      pfrslot->linearVertAdvance = metrics->vertAdvance;

      /* make up vertical metrics(?) */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;

#if 0 /* some fonts seem to be broken here! */

      /* Apply the font matrix, if any.                 */
      /* TODO: Test existing fonts with unusual matrix  */
      /* whether we have to adjust Units per EM.        */
      {
        FT_Matrix font_matrix;


        font_matrix.xx = face->log_font.matrix[0] << 8;
        font_matrix.yx = face->log_font.matrix[1] << 8;
        font_matrix.xy = face->log_font.matrix[2] << 8;
        font_matrix.yy = face->log_font.matrix[3] << 8;

        FT_Outline_Transform( outline, &font_matrix );
      }
#endif

      /* scale when needed */
      if ( scaling )
      {
        FT_Int      n;
        FT_Fixed    x_scale = pfrsize->metrics.x_scale;
        FT_Fixed    y_scale = pfrsize->metrics.y_scale;
        FT_Vector*  vec     = outline->points;


        /* scale outline points */
        for ( n = 0; n < outline->n_points; n++, vec++ )
        {
          vec->x = FT_MulFix( vec->x, x_scale );
          vec->y = FT_MulFix( vec->y, y_scale );
        }

        /* scale the advance */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the rest of the metrics */
      FT_Outline_Get_CBox( outline, &cbox );

      metrics->width        = cbox.xMax - cbox.xMin;
      metrics->height       = cbox.yMax - cbox.yMin;
      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax - metrics->height;
    }

  Exit:
    return error;
  }